

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * extraZddCombination(DdManager *dd,int *VarValues,int nVars)

{
  DdNode *pDVar1;
  int local_44;
  DdNode *zTemp;
  DdNode *zRes;
  int local_28;
  int index;
  int lev;
  int nVars_local;
  int *VarValues_local;
  DdManager *dd_local;
  
  zTemp = dd->one;
  *(int *)(((ulong)zTemp & 0xfffffffffffffffe) + 4) =
       *(int *)(((ulong)zTemp & 0xfffffffffffffffe) + 4) + 1;
  local_28 = nVars + -1;
  do {
    if (local_28 < 0) {
      *(int *)(((ulong)zTemp & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)zTemp & 0xfffffffffffffffe) + 4) + -1;
      return zTemp;
    }
    if (local_28 < dd->sizeZ) {
      local_44 = dd->invpermZ[local_28];
    }
    else {
      local_44 = local_28;
    }
    if (VarValues[local_44] == 1) {
      pDVar1 = cuddZddGetNode(dd,local_44,zTemp,dd->zero);
      if (pDVar1 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(dd,zTemp);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
      *(int *)(((ulong)zTemp & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)zTemp & 0xfffffffffffffffe) + 4) + -1;
      zTemp = pDVar1;
    }
    local_28 = local_28 + -1;
  } while( true );
}

Assistant:

DdNode * extraZddCombination(
  DdManager* dd, 
  int* VarValues, 
  int nVars )
{
    int lev, index;
    DdNode *zRes, *zTemp;

    /* transform the combination from the array VarValues into a ZDD cube. */
    zRes = dd->one;
    cuddRef(zRes);

    /*  go through levels starting bottom-up and create nodes 
     *  if these variables are present in the comb
     */
    for (lev = nVars - 1; lev >= 0; lev--) 
    { 
        index = (lev >= dd->sizeZ) ? lev : dd->invpermZ[lev];
        if (VarValues[index] == 1) 
        {
            /* compose zRes with ZERO for the given ZDD variable */
            zRes = cuddZddGetNode( dd, index, zTemp = zRes, dd->zero );
            if ( zRes == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                return NULL;
            }
            cuddRef( zRes );
            cuddDeref( zTemp );
        }
    }
    cuddDeref( zRes );
    return zRes;

}